

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::RecursiveMessage::_InternalSerialize
          (RecursiveMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  RecursiveMessage *value;
  void *data;
  anon_union_24_1_493b367e_for_RecursiveMessage_3 aVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  string_view s;
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    value = (this->field_0)._impl_.recurse_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,&value->super_MessageLite,*(int *)((long)&value->field_0 + 4),target,
                        stream);
  }
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.payload_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s._M_str = (char *)*puVar2;
    s._M_len = puVar2[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffe;
    data = *(void **)(uVar3 + 8);
    size = *(uint *)(uVar3 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL RecursiveMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const RecursiveMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.RecursiveMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.RecursiveMessage recurse = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.recurse_, this_._impl_.recurse_->GetCachedSize(), target,
        stream);
  }

  // bytes payload = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_payload();
    target = stream->WriteBytesMaybeAliased(2, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.RecursiveMessage)
  return target;
}